

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O0

size_t shell_quotearg(char *path,uchar *buf,size_t bufsize)

{
  uchar *puVar1;
  int local_44;
  anon_enum_32 state;
  uchar *endp;
  uchar *dst;
  char *src;
  size_t bufsize_local;
  uchar *buf_local;
  char *path_local;
  
  local_44 = 0;
  puVar1 = buf + bufsize;
  endp = buf;
  dst = (uchar *)path;
  while( true ) {
    if (*dst == '\0' || puVar1 + -1 <= endp) {
      if (local_44 != 0) {
        if (local_44 == 1) {
          if (puVar1 <= endp + 1) {
            return 0;
          }
          *endp = '\'';
          endp = endp + 1;
        }
        else if (local_44 == 2) {
          if (puVar1 <= endp + 1) {
            return 0;
          }
          *endp = '\"';
          endp = endp + 1;
        }
      }
      if (endp + 1 < puVar1) {
        *endp = '\0';
        path_local = (char *)(endp + -(long)buf);
      }
      else {
        path_local = (char *)0x0;
      }
      return (size_t)path_local;
    }
    if (*dst == '!') {
      if (local_44 == 0) {
        if (puVar1 <= endp + 1) {
          return 0;
        }
        *endp = '\\';
        endp = endp + 1;
      }
      else if (local_44 == 1) {
        if (puVar1 <= endp + 2) {
          return 0;
        }
        *endp = '\'';
        endp[1] = '\\';
        endp = endp + 2;
      }
      else if (local_44 == 2) {
        if (puVar1 <= endp + 2) {
          return 0;
        }
        *endp = '\"';
        endp[1] = '\\';
        endp = endp + 2;
      }
      local_44 = 0;
    }
    else if (*dst == '\'') {
      if (local_44 == 0) {
        if (puVar1 <= endp + 1) {
          return 0;
        }
        *endp = '\"';
        endp = endp + 1;
      }
      else if (local_44 == 1) {
        if (puVar1 <= endp + 2) {
          return 0;
        }
        *endp = '\'';
        endp[1] = '\"';
        endp = endp + 2;
      }
      local_44 = 2;
    }
    else {
      if (local_44 == 0) {
        if (puVar1 <= endp + 1) {
          return 0;
        }
        *endp = '\'';
        endp = endp + 1;
      }
      else if ((local_44 != 1) && (local_44 == 2)) {
        if (puVar1 <= endp + 2) {
          return 0;
        }
        *endp = '\"';
        endp[1] = '\'';
        endp = endp + 2;
      }
      local_44 = 1;
    }
    if (puVar1 <= endp + 1) break;
    *endp = *dst;
    endp = endp + 1;
    dst = dst + 1;
  }
  return 0;
}

Assistant:

static size_t
shell_quotearg(const char *path, unsigned char *buf,
               size_t bufsize)
{
    const char *src;
    unsigned char *dst, *endp;

    /*
     * Processing States:
     *  UQSTRING:       unquoted string: ... -- used for quoting exclamation
     *                  marks. This is the initial state
     *  SQSTRING:       single-quoted-string: '... -- any character may follow
     *  QSTRING:        quoted string: "... -- only apostrophes may follow
     */
    enum { UQSTRING, SQSTRING, QSTRING } state = UQSTRING;

    endp = &buf[bufsize];
    src = path;
    dst = buf;
    while(*src && dst < endp - 1) {

        switch(*src) {
            /*
             * Special handling for apostrophe.
             * An apostrophe is always written in quotation marks, e.g.
             * ' -> "'".
             */

        case '\'':
            switch(state) {
            case UQSTRING:      /* Unquoted string */
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '"';
                break;
            case QSTRING:       /* Continue quoted string */
                break;
            case SQSTRING:      /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '"';
                break;
            default:
                break;
            }
            state = QSTRING;
            break;

            /*
             * Special handling for exclamation marks. CSH interprets
             * exclamation marks even when quoted with apostrophes. We convert
             * it to the plain string \!, because both Bourne Shell and CSH
             * interpret that as a verbatim exclamation mark.
             */

        case '!':
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\\';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\\';
                break;
            case SQSTRING:              /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '\\';
                break;
            default:
                break;
            }
            state = UQSTRING;
            break;

            /*
             * Ordinary character: prefer single-quoted string
             */

        default:
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\'';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\'';
                break;
            case SQSTRING:      /* Continue single quoted string */
                break;
            default:
                break;
            }
            state = SQSTRING;   /* Start single-quoted string */
            break;
        }

        if(dst + 1 >= endp)
            return 0;
        *dst++ = *src++;
    }

    switch(state) {
    case UQSTRING:
        break;
    case QSTRING:           /* Close quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '"';
        break;
    case SQSTRING:          /* Close single quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '\'';
        break;
    default:
        break;
    }

    if(dst + 1 >= endp)
        return 0;
    *dst = '\0';

    /* The result cannot be larger than 3 * strlen(path) + 2 */
    /* assert((dst - buf) <= (3 * (src - path) + 2)); */

    return dst - buf;
}